

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

string * pretty_abi_cxx11_(string *__return_storage_ptr__,size_t value,size_t scale,char **units,
                          int m)

{
  long lVar1;
  size_t sVar2;
  float fVar3;
  float fVar4;
  char buffer [256];
  char acStack_118 [264];
  
  fVar3 = (float)value;
  fVar4 = (float)scale;
  if (m < 2 || fVar3 <= fVar4) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      fVar3 = fVar3 / fVar4;
      lVar1 = lVar1 + 1;
      if (fVar3 <= fVar4) break;
    } while ((int)lVar1 < m + -1);
  }
  sprintf(acStack_118,"%.6f %s",(double)fVar3,units[lVar1]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(acStack_118);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_118,acStack_118 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty(size_t value, size_t scale, const char* *units, int m) {
    int count = 0;
    float d = value;
    while (d > scale && count < m - 1) {
        d /= scale;
        count += 1;
    }
    char buffer[256];
    sprintf(buffer, "%.6f %s", d, units[count]);
    return buffer;
}